

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filereader.cpp
# Opt level: O3

Filereader * Filereader::getFilereader(HighsLogOptions *log_options,string *filename)

{
  pointer pcVar1;
  string filename_00;
  string filename_01;
  int iVar2;
  Filereader *pFVar3;
  undefined *puVar4;
  size_type sVar5;
  string lower_case_extension;
  string extension;
  undefined8 in_stack_ffffffffffffff58;
  _Alloc_hider in_stack_ffffffffffffff60;
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  size_type in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  string local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + filename->_M_string_length);
  filename_00._M_string_length = (size_type)in_stack_ffffffffffffff60._M_p;
  filename_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff58;
  filename_00.field_2._M_allocated_capacity = in_stack_ffffffffffffff68;
  filename_00.field_2._8_8_ = in_stack_ffffffffffffff70;
  getFilenameExt(&local_80,filename_00);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar2 == 0) {
    std::__cxx11::string::substr((ulong)local_60,(ulong)filename);
    filename_01._M_string_length = (size_type)in_stack_ffffffffffffff60._M_p;
    filename_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff58;
    filename_01.field_2._M_allocated_capacity = in_stack_ffffffffffffff68;
    filename_01.field_2._8_8_ = in_stack_ffffffffffffff70;
    getFilenameExt((string *)&stack0xffffffffffffff60,filename_01);
    std::__cxx11::string::_M_assign((string *)&local_80);
    if (in_stack_ffffffffffffff60._M_p != &stack0xffffffffffffff70) {
      operator_delete(in_stack_ffffffffffffff60._M_p);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
  }
  _Var6._M_p = &stack0xffffffffffffff70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff60,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length);
  _Var7._M_p = _Var6._M_p;
  if (in_stack_ffffffffffffff68 != 0) {
    sVar5 = 0;
    do {
      iVar2 = tolower((uint)(byte)_Var6._M_p[sVar5]);
      _Var6._M_p[sVar5] = (char)iVar2;
      sVar5 = sVar5 + 1;
    } while (in_stack_ffffffffffffff68 != sVar5);
  }
  iVar2 = std::__cxx11::string::compare(&stack0xffffffffffffff60);
  if (iVar2 == 0) {
    pFVar3 = (Filereader *)operator_new(8);
    puVar4 = &FilereaderMps::vtable;
  }
  else {
    iVar2 = std::__cxx11::string::compare(&stack0xffffffffffffff60);
    if (iVar2 == 0) {
      pFVar3 = (Filereader *)operator_new(0x10);
      pFVar3->_vptr_Filereader = (_func_int **)0x0;
      pFVar3[1]._vptr_Filereader = (_func_int **)0x0;
      puVar4 = &FilereaderLp::vtable;
    }
    else {
      iVar2 = std::__cxx11::string::compare(&stack0xffffffffffffff60);
      if (iVar2 != 0) {
        pFVar3 = (Filereader *)0x0;
        goto LAB_001eb51e;
      }
      pFVar3 = (Filereader *)operator_new(8);
      puVar4 = &FilereaderEms::vtable;
    }
  }
  pFVar3->_vptr_Filereader = (_func_int **)(puVar4 + 0x10);
LAB_001eb51e:
  if (_Var7._M_p != &stack0xffffffffffffff70) {
    operator_delete(_Var7._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return pFVar3;
}

Assistant:

Filereader* Filereader::getFilereader(const HighsLogOptions& log_options,
                                      const std::string filename) {
  Filereader* reader;
  std::string extension = getFilenameExt(filename);
  if (extension == "gz") {
#ifdef ZLIB_FOUND
    extension = getFilenameExt(filename.substr(0, filename.size() - 3));
#else
    highsLogUser(log_options, HighsLogType::kError,
                 "HiGHS build without zlib support. Cannot read .gz file.\n",
                 filename.c_str());
    reader = NULL;
#endif
    //  } else if (extension == "zip") {
    // #ifdef ZLIB_FOUND
    //    extension = getFilenameExt(filename.substr(0, filename.size() - 4));
    // #else
    //    highsLogUser(log_options, HighsLogType::kError,
    //                 "HiGHS build without zlib support. Cannot read .zip
    //                 file.\n", filename.c_str());
    //    reader = NULL;
    // #endif
  }
  std::string lower_case_extension = extension;
  tolower(lower_case_extension);
  if (lower_case_extension.compare("mps") == 0) {
    reader = new FilereaderMps();
  } else if (lower_case_extension.compare("lp") == 0) {
    reader = new FilereaderLp();
  } else if (lower_case_extension.compare("ems") == 0) {
    reader = new FilereaderEms();
  } else {
    reader = NULL;
  }
  return reader;
}